

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O0

void __thiscall PcodeOpBank::clear(PcodeOpBank *this)

{
  PcodeOp *pPVar1;
  bool bVar2;
  reference ppPVar3;
  _Self local_48;
  _List_node_base *local_40;
  _Self local_38;
  _List_node_base *local_30;
  _Self local_28;
  _List_node_base *local_20;
  _List_iterator<PcodeOp_*> local_18;
  iterator iter;
  PcodeOpBank *this_local;
  
  iter._M_node = (_List_node_base *)this;
  std::_List_iterator<PcodeOp_*>::_List_iterator(&local_18);
  local_20 = (_List_node_base *)
             std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::begin(&this->alivelist);
  local_18._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::end(&this->alivelist);
    bVar2 = std::operator!=(&local_18,&local_28);
    if (!bVar2) break;
    ppPVar3 = std::_List_iterator<PcodeOp_*>::operator*(&local_18);
    pPVar1 = *ppPVar3;
    if (pPVar1 != (PcodeOp *)0x0) {
      PcodeOp::~PcodeOp(pPVar1);
      operator_delete(pPVar1);
    }
    std::_List_iterator<PcodeOp_*>::operator++(&local_18);
  }
  local_30 = (_List_node_base *)
             std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::begin(&this->deadlist);
  local_18._M_node = local_30;
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::end(&this->deadlist);
    bVar2 = std::operator!=(&local_18,&local_38);
    if (!bVar2) break;
    ppPVar3 = std::_List_iterator<PcodeOp_*>::operator*(&local_18);
    pPVar1 = *ppPVar3;
    if (pPVar1 != (PcodeOp *)0x0) {
      PcodeOp::~PcodeOp(pPVar1);
      operator_delete(pPVar1);
    }
    std::_List_iterator<PcodeOp_*>::operator++(&local_18);
  }
  local_40 = (_List_node_base *)
             std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::begin(&this->deadandgone);
  local_18._M_node = local_40;
  while( true ) {
    local_48._M_node =
         (_List_node_base *)
         std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::end(&this->deadandgone);
    bVar2 = std::operator!=(&local_18,&local_48);
    if (!bVar2) break;
    ppPVar3 = std::_List_iterator<PcodeOp_*>::operator*(&local_18);
    pPVar1 = *ppPVar3;
    if (pPVar1 != (PcodeOp *)0x0) {
      PcodeOp::~PcodeOp(pPVar1);
      operator_delete(pPVar1);
    }
    std::_List_iterator<PcodeOp_*>::operator++(&local_18);
  }
  std::
  map<SeqNum,_PcodeOp_*,_std::less<SeqNum>,_std::allocator<std::pair<const_SeqNum,_PcodeOp_*>_>_>::
  clear(&this->optree);
  std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::clear(&this->alivelist);
  std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::clear(&this->deadlist);
  clearCodeLists(this);
  std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::clear(&this->deadandgone);
  this->uniqid = 0;
  return;
}

Assistant:

void PcodeOpBank::clear(void)

{
  list<PcodeOp *>::iterator iter;

  for(iter=alivelist.begin();iter!=alivelist.end();++iter)
    delete *iter;
  for(iter=deadlist.begin();iter!=deadlist.end();++iter)
    delete *iter;
  for(iter=deadandgone.begin();iter!=deadandgone.end();++iter)
    delete *iter;
  optree.clear();
  alivelist.clear();
  deadlist.clear();
  clearCodeLists();
  deadandgone.clear();
  uniqid = 0;
}